

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::base_internal::LowLevelAlloc::Arena::Arena(Arena *this,uint32_t flags_value)

{
  size_t sVar1;
  uintptr_t uVar2;
  uint32_t flags_value_local;
  Arena *this_local;
  
  SpinLock::SpinLock(&this->mu,SCHEDULE_KERNEL_ONLY);
  this->allocation_count = 0;
  this->flags = flags_value;
  sVar1 = anon_unknown_0::GetPageSize();
  this->pagesize = sVar1;
  sVar1 = anon_unknown_0::RoundedUpBlockSize();
  this->round_up = sVar1;
  this->min_size = this->round_up << 1;
  this->random = 0;
  (this->freelist).header.size = 0;
  uVar2 = Magic(0xffffffffb37cc16a,&(this->freelist).header);
  (this->freelist).header.magic = uVar2;
  (this->freelist).header.arena = this;
  (this->freelist).levels = 0;
  memset((this->freelist).next,0,0xf0);
  return;
}

Assistant:

LowLevelAlloc::Arena::Arena(uint32_t flags_value)
    : mu(base_internal::SCHEDULE_KERNEL_ONLY),
      allocation_count(0),
      flags(flags_value),
      pagesize(GetPageSize()),
      round_up(RoundedUpBlockSize()),
      min_size(2 * round_up),
      random(0) {
  freelist.header.size = 0;
  freelist.header.magic = Magic(kMagicUnallocated, &freelist.header);
  freelist.header.arena = this;
  freelist.levels = 0;
  memset(freelist.next, 0, sizeof(freelist.next));
}